

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_stuff.cpp
# Opt level: O1

bool ST_Responder(event_t *ev)

{
  ulong uVar1;
  bool bVar2;
  ulong uVar3;
  int numcheats;
  cheatseq_t *cheats;
  
  if (!allcheats.Value) {
    switch(gameinfo.gametype) {
    case GAME_Doom:
      numcheats = 0x11;
      cheats = DoomCheats;
      break;
    case GAME_Heretic:
      numcheats = 0x19;
      cheats = HereticCheats;
      break;
    case GAME_Heretic|GAME_Doom:
    case GAME_Hexen|GAME_Doom:
    case GAME_Raven:
    case GAME_Raven|GAME_Doom:
      return false;
    case GAME_Hexen:
      numcheats = 0xd;
      cheats = HexenCheats;
      break;
    case GAME_Strife:
      numcheats = 0x16;
      cheats = StrifeCheats;
      break;
    default:
      if (gameinfo.gametype != GAME_Chex) {
        return false;
      }
      numcheats = 0xf;
      cheats = ChexCheats;
    }
    bVar2 = CheatCheckList(ev,cheats,numcheats);
    return bVar2;
  }
  bVar2 = CheatCheckList(ev,DoomCheats,0x11);
  if (bVar2) {
    return true;
  }
  uVar1 = 0;
  do {
    uVar3 = uVar1;
    if (uVar3 == 5) break;
    bVar2 = CheatCheckList(ev,ST_Responder::cheatlists[uVar3 + 1],ST_Responder::counts[uVar3 + 1]);
    uVar1 = uVar3 + 1;
  } while (!bVar2);
  return uVar3 < 5;
}

Assistant:

bool ST_Responder (event_t *ev)
{
	bool eat = false;

	if (!allcheats)
	{
		cheatseq_t *cheats;
		int numcheats;

		switch (gameinfo.gametype)
		{
		case GAME_Doom:
			cheats = DoomCheats;
			numcheats = countof(DoomCheats);
			break;

		case GAME_Heretic:
			cheats = HereticCheats;
			numcheats = countof(HereticCheats);
			break;

		case GAME_Hexen:
			cheats = HexenCheats;
			numcheats = countof(HexenCheats);
			break;

		case GAME_Strife:
			cheats = StrifeCheats;
			numcheats = countof(StrifeCheats);
			break;

		case GAME_Chex:
			cheats = ChexCheats;
			numcheats = countof(ChexCheats);
			break;

		default:
			return false;
		}
		return CheatCheckList(ev, cheats, numcheats);
	}
	else
	{
		static cheatseq_t *cheatlists[] = { DoomCheats, HereticCheats, HexenCheats, StrifeCheats, ChexCheats, SpecialCheats };
		static int counts[] = { countof(DoomCheats), countof(HereticCheats)-2, countof(HexenCheats), 
								countof(StrifeCheats), countof(ChexCheats)-1, countof(SpecialCheats) };

		for (size_t i=0; i<countof(cheatlists); i++)
		{
			if (CheatCheckList(ev, cheatlists[i], counts[i])) return true;
		}
	}
	return false;
}